

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateVisitCode
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "$name$_ = visitor.visitString(\n    has$capitalized_name$(), $name$_,\n    other.has$capitalized_name$(), other.$name$_);\n"
  ;
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    text = 
    "$name$_ = visitor.visitString(!$name$_.isEmpty(), $name$_,\n    !other.$name$_.isEmpty(), other.$name$_);\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::
GenerateVisitCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "$name$_ = visitor.visitString(\n"
      "    has$capitalized_name$(), $name$_,\n"
      "    other.has$capitalized_name$(), other.$name$_);\n");
  } else {
    printer->Print(variables_,
      "$name$_ = visitor.visitString(!$name$_.isEmpty(), $name$_,\n"
      "    !other.$name$_.isEmpty(), other.$name$_);\n");
  }
}